

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplaceRealloc<slang::ast::LValue::ElementIndex>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,pointer pos,ElementIndex *args)

{
  ulong uVar1;
  pointer pvVar2;
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  *__result;
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  *__result_00;
  ulong uVar3;
  move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
  __last;
  move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
  __first;
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  *this_00;
  
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  uVar3 = this->len + 1;
  uVar1 = this->cap;
  if (uVar3 < uVar1 * 2) {
    uVar3 = uVar1 * 2;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    uVar3 = 0x1745d1745d1745d;
  }
  pvVar2 = this->data_;
  __result = (variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
              *)operator_new(uVar3 * 0x58);
  this_00 = __result + ((long)pos - (long)pvVar2);
  std::
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  ::variant<slang::ast::LValue::ElementIndex,void,void,slang::ast::LValue::ElementIndex,void>
            (this_00,args);
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
              (__first,(move_iterator<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_*>
                        )pos,
               (variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = this_00 + 0x58;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
            (__first,__last,
             (variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
              *)__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = uVar3;
  this->data_ = (pointer)__result;
  return (pointer)this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}